

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vk_mem_alloc.h
# Opt level: O2

void vmaFreeMemoryPages(VmaAllocator allocator,size_t allocationCount,VmaAllocation *pAllocations)

{
  VmaAllocation_T *this;
  VmaPool this_00;
  bool bVar1;
  
  if (allocationCount != 0) {
    while (bVar1 = allocationCount != 0, allocationCount = allocationCount - 1, bVar1) {
      this = pAllocations[allocationCount];
      if (this != (VmaAllocation_T *)0x0) {
        VmaAllocation_T::FreeName(this,allocator);
        if (this->m_Type == '\x02') {
          VmaAllocator_T::FreeDedicatedMemory(allocator,this);
        }
        else if (this->m_Type == '\x01') {
          this_00 = VmaAllocation_T::GetParentPool(this);
          if (this_00 == (VmaPool)0x0) {
            this_00 = (VmaPool)allocator->m_pBlockVectors[this->m_MemoryTypeIndex];
          }
          VmaBlockVector::Free(&this_00->m_BlockVector,this);
        }
      }
    }
    return;
  }
  return;
}

Assistant:

VMA_CALL_PRE void VMA_CALL_POST vmaFreeMemoryPages(
    VmaAllocator allocator,
    size_t allocationCount,
    const VmaAllocation* pAllocations)
{
    if(allocationCount == 0)
    {
        return;
    }

    VMA_ASSERT(allocator);

    VMA_DEBUG_LOG("vmaFreeMemoryPages");

    VMA_DEBUG_GLOBAL_MUTEX_LOCK

    allocator->FreeMemory(allocationCount, pAllocations);
}